

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestFailure.cpp
# Opt level: O2

void __thiscall
UnsignedLongsEqualFailure::UnsignedLongsEqualFailure
          (UnsignedLongsEqualFailure *this,UtestShell *test,char *fileName,int lineNumber,
          unsigned_long expected,unsigned_long actual,SimpleString *text)

{
  SimpleString *this_00;
  SimpleString *rhs;
  undefined1 local_60 [8];
  SimpleString aDecimal;
  SimpleString expectedReported;
  SimpleString eHex;
  SimpleString eDecimal;
  SimpleString aHex;
  SimpleString local_30;
  SimpleString actualReported;
  
  TestFailure::TestFailure(&this->super_TestFailure,test,fileName,lineNumber);
  (this->super_TestFailure)._vptr_TestFailure = (_func_int **)&PTR__TestFailure_001e0ba0;
  TestFailure::createUserText((TestFailure *)&aDecimal,(SimpleString *)test);
  this_00 = &(this->super_TestFailure).message_;
  SimpleString::operator=(this_00,&aDecimal);
  SimpleString::~SimpleString(&aDecimal);
  StringFrom((unsigned_long)&aDecimal);
  HexStringFrom((unsigned_long)&aHex);
  StringFrom((unsigned_long)&eDecimal);
  HexStringFrom((unsigned_long)&eHex);
  SimpleString::padStringsToSameLength(&aDecimal,&eDecimal,' ');
  SimpleString::padStringsToSameLength(&aHex,&eHex,'0');
  SimpleString::SimpleString((SimpleString *)local_60," 0x");
  SimpleString::operator+(&expectedReported,&aDecimal);
  SimpleString::operator+(&actualReported,&expectedReported);
  SimpleString::~SimpleString(&expectedReported);
  SimpleString::~SimpleString((SimpleString *)local_60);
  SimpleString::SimpleString(&local_30," 0x");
  SimpleString::operator+((SimpleString *)local_60,&eDecimal);
  rhs = (SimpleString *)local_60;
  SimpleString::operator+(&expectedReported,rhs);
  SimpleString::~SimpleString((SimpleString *)local_60);
  SimpleString::~SimpleString(&local_30);
  TestFailure::createButWasString((TestFailure *)local_60,rhs,&expectedReported);
  SimpleString::operator+=(this_00,(SimpleString *)local_60);
  SimpleString::~SimpleString((SimpleString *)local_60);
  SimpleString::~SimpleString(&expectedReported);
  SimpleString::~SimpleString(&actualReported);
  SimpleString::~SimpleString(&eHex);
  SimpleString::~SimpleString(&eDecimal);
  SimpleString::~SimpleString(&aHex);
  SimpleString::~SimpleString(&aDecimal);
  return;
}

Assistant:

UnsignedLongsEqualFailure::UnsignedLongsEqualFailure(UtestShell* test, const char* fileName, int lineNumber, unsigned long expected, unsigned long actual, const SimpleString& text)
: TestFailure(test, fileName, lineNumber)
{
    message_ = createUserText(text);

    SimpleString aDecimal = StringFrom(actual);
    SimpleString aHex = HexStringFrom(actual);
    SimpleString eDecimal = StringFrom(expected);
    SimpleString eHex = HexStringFrom(expected);

    SimpleString::padStringsToSameLength(aDecimal, eDecimal, ' ');
    SimpleString::padStringsToSameLength(aHex, eHex, '0');

    SimpleString actualReported = aDecimal + " 0x" + aHex;
    SimpleString expectedReported = eDecimal + " 0x" + eHex;
    message_ += createButWasString(expectedReported, actualReported);
}